

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

BucketWidthType duckdb::TimeBucket::ClassifyBucketWidthErrorThrow(interval_t bucket_width)

{
  BucketWidthType BVar1;
  NotImplementedException *pNVar2;
  int64_t iVar3;
  long in_RSI;
  ulong in_RDI;
  string local_50;
  interval_t local_30;
  
  if ((int)in_RDI == 0) {
    iVar3 = Interval::GetMicro(&local_30);
    if (iVar3 < 1) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Period must be greater than 0","");
      NotImplementedException::NotImplementedException(pNVar2,&local_50);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    BVar1 = CONVERTIBLE_TO_MICROS;
  }
  else {
    if ((in_RDI >> 0x20 != 0) || (in_RSI != 0)) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Month intervals cannot have day or time component","");
      NotImplementedException::NotImplementedException(pNVar2,&local_50);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    BVar1 = CONVERTIBLE_TO_MONTHS;
    if ((int)in_RDI < 0) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Period must be greater than 0","");
      NotImplementedException::NotImplementedException(pNVar2,&local_50);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return BVar1;
}

Assistant:

static inline BucketWidthType ClassifyBucketWidthErrorThrow(const interval_t bucket_width) {
		if (bucket_width.months == 0) {
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			if (bucket_width_micros <= 0) {
				throw NotImplementedException("Period must be greater than 0");
			}
			return BucketWidthType::CONVERTIBLE_TO_MICROS;
		} else if (bucket_width.months != 0 && bucket_width.days == 0 && bucket_width.micros == 0) {
			if (bucket_width.months < 0) {
				throw NotImplementedException("Period must be greater than 0");
			}
			return BucketWidthType::CONVERTIBLE_TO_MONTHS;
		} else {
			throw NotImplementedException("Month intervals cannot have day or time component");
		}
	}